

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpacking.cpp
# Opt level: O0

uint32_t * pack12_8(uint32_t base,uint32_t *in,uint32_t *out)

{
  uint *puVar1;
  uint32_t *out_local;
  uint32_t *in_local;
  uint32_t base_local;
  
  *out = *in - base;
  *out = (in[1] - base) * 0x1000 | *out;
  *out = (in[2] - base) * 0x1000000 | *out;
  puVar1 = out + 1;
  *puVar1 = in[2] - base >> 8;
  *puVar1 = (in[3] - base) * 0x10 | *puVar1;
  *puVar1 = (in[4] - base) * 0x10000 | *puVar1;
  *puVar1 = (in[5] - base) * 0x10000000 | *puVar1;
  puVar1 = out + 2;
  *puVar1 = in[5] - base >> 4;
  *puVar1 = (in[6] - base) * 0x100 | *puVar1;
  *puVar1 = (in[7] - base) * 0x100000 | *puVar1;
  return out + 3;
}

Assistant:

uint32_t * pack12_8( uint32_t base,  uint32_t *   in, uint32_t *    out) {

    *out =  static_cast<uint32_t>((*in) -base)  ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  12 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  24 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 12  -  4 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  4 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  16 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  28 ;
    ++out;
    *out =  static_cast<uint32_t>( (*in) - base ) >> ( 12  -  8 );
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  8 ;
    ++in;
    *out |= static_cast<uint32_t>( (*in) - base  ) <<  20 ;
    ++out;
    ++in;

    return out;
}